

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rc_model_v2_smt.c
# Opt level: O3

MPP_RET rc_model_v2_smt_h265_init(void *ctx,RcCfg *cfg)

{
  if (((byte)rc_debug & 1) != 0) {
    _mpp_log_l(4,"rc_model_v2_smt","enter %p\n","rc_model_v2_smt_h265_init",ctx);
  }
  memcpy(ctx,cfg,0x104);
  bits_model_smt_init((RcModelV2SmtCtx *)ctx);
  if (((byte)rc_debug & 1) != 0) {
    _mpp_log_l(4,"rc_model_v2_smt","leave %p\n","rc_model_v2_smt_h265_init",ctx);
  }
  return MPP_OK;
}

Assistant:

MPP_RET rc_model_v2_smt_h265_init(void *ctx, RcCfg *cfg)
{
    RcModelV2SmtCtx *p = (RcModelV2SmtCtx*)ctx;

    rc_dbg_func("enter %p\n", ctx);

    memcpy(&p->usr_cfg, cfg, sizeof(RcCfg));
    bits_model_smt_init(p);

    rc_dbg_func("leave %p\n", ctx);
    return MPP_OK;
}